

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::~Vector
          (Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *this)

{
  DataLocation *pDVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *pRVar2;
  DataLocation *pDVar3;
  ArrayDisposer *pAVar4;
  
  pDVar1 = (this->builder).ptr;
  if (pDVar1 != (DataLocation *)0x0) {
    pRVar2 = (this->builder).pos;
    pDVar3 = (this->builder).endPtr;
    (this->builder).ptr = (DataLocation *)0x0;
    (this->builder).pos =
         (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)0x0;
    (this->builder).endPtr = (DataLocation *)0x0;
    pAVar4 = (this->builder).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pDVar1,8,(long)pRVar2 - (long)pDVar1 >> 3,(long)pDVar3 - (long)pDVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }